

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O1

uv_os_sock_t create_bound_socket(sockaddr_in bind_addr)

{
  long *plVar1;
  __pthread_list_t *handle;
  uv_handle_t *handle_00;
  uv_loop_t *handle_01;
  long lVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int extraout_EAX;
  uint uVar6;
  int extraout_EAX_00;
  uv_os_sock_t extraout_EAX_01;
  uv_os_sock_t extraout_EAX_02;
  uv_os_sock_t extraout_EAX_03;
  uv_os_sock_t extraout_EAX_04;
  connection_context_t *handle_02;
  uv_poll_t *handle_03;
  ssize_t sVar7;
  ulong uVar8;
  int *piVar9;
  uint extraout_EDX;
  size_t sVar10;
  ulong unaff_RBX;
  uv_handle_type uVar11;
  uv_handle_type uVar12;
  sockaddr *__addr;
  uv_poll_t *puVar13;
  undefined8 *puVar14;
  uv_loop_t *puVar15;
  uv_loop_t *puVar16;
  uv_loop_t *puVar17;
  int yes;
  socklen_t sStack_44;
  sockaddr sStack_40;
  code *pcStack_30;
  undefined4 local_1c;
  sockaddr local_18;
  
  puVar14 = (undefined8 *)0x2;
  pcStack_30 = (code *)0x1651a6;
  uVar3 = socket(2,1,0);
  if ((int)uVar3 < 0) {
    pcStack_30 = (code *)0x1651f4;
    create_bound_socket_cold_1();
LAB_001651f4:
    pcStack_30 = (code *)0x1651f9;
    create_bound_socket_cold_2();
  }
  else {
    unaff_RBX = (ulong)uVar3;
    local_1c = 1;
    puVar14 = (undefined8 *)(ulong)uVar3;
    pcStack_30 = (code *)0x1651ce;
    iVar4 = setsockopt(uVar3,1,2,&local_1c,4);
    if (iVar4 != 0) goto LAB_001651f4;
    puVar14 = (undefined8 *)(ulong)uVar3;
    pcStack_30 = (code *)0x1651e3;
    iVar4 = bind(uVar3,&local_18,0x10);
    if (iVar4 == 0) {
      return uVar3;
    }
  }
  pcStack_30 = server_poll_cb;
  create_bound_socket_cold_3();
  handle_00 = (uv_handle_t *)*puVar14;
  sStack_44 = 0x10;
  iVar4 = *(int *)((long)&handle_00[1].u + 0x10);
  __addr = &sStack_40;
  pcStack_30 = (code *)unaff_RBX;
  iVar5 = accept(iVar4,__addr,&sStack_44);
  uVar11 = (uv_handle_type)__addr;
  if (iVar5 < 0) {
    server_poll_cb_cold_1();
  }
  else {
    handle_02 = create_connection_context(iVar5,1);
    handle_02->events = 7;
    uVar11 = UV_NAMED_PIPE;
    iVar5 = uv_poll_start(&handle_02->poll_handle,7,connection_poll_cb);
    iVar4 = (int)handle_02;
    if (iVar5 == 0) {
      iVar4 = *(int *)((long)&handle_00[1].u + 0x14) + 1;
      *(int *)((long)&handle_00[1].u + 0x14) = iVar4;
      if (iVar4 == 5) {
        close_socket(*(uv_os_sock_t *)((long)&handle_00[1].u + 0x10));
        uv_close(handle_00,server_close_cb);
        iVar4 = extraout_EAX;
      }
      return iVar4;
    }
  }
  server_poll_cb_cold_2();
  puVar15 = (uv_loop_t *)0x170;
  uVar12 = uVar11;
  handle_03 = (uv_poll_t *)malloc(0x170);
  if (handle_03 == (uv_poll_t *)0x0) {
    create_connection_context_cold_3();
LAB_00165328:
    create_connection_context_cold_1();
  }
  else {
    handle_03[1].io_watcher.fd = iVar4;
    handle_03[2].type = uVar11;
    handle_03[2].data = (void *)0x0;
    handle_03[2].loop = (uv_loop_t *)0x0;
    *(undefined8 *)&handle_03[2].field_0x14 = 0;
    *(undefined8 *)((long)&handle_03[2].close_cb + 4) = 0;
    *(undefined8 *)((long)handle_03[2].handle_queue + 4) = 0;
    puVar15 = uv_default_loop();
    puVar13 = handle_03;
    iVar4 = uv_poll_init_socket(puVar15,handle_03,iVar4);
    uVar12 = (uv_handle_type)puVar13;
    *(int *)&handle_03[2].field_0x14 = *(int *)&handle_03[2].field_0x14 + 1;
    handle_03->data = handle_03;
    if (iVar4 != 0) goto LAB_00165328;
    puVar15 = uv_default_loop();
    puVar13 = handle_03 + 1;
    iVar4 = uv_timer_init(puVar15,(uv_timer_t *)puVar13);
    uVar12 = (uv_handle_type)puVar13;
    *(int *)&handle_03[2].field_0x14 = *(int *)&handle_03[2].field_0x14 + 1;
    handle_03[1].data = handle_03;
    if (iVar4 == 0) {
      return (uv_os_sock_t)handle_03;
    }
  }
  create_connection_context_cold_2();
  puVar16 = puVar15;
  if (uVar12 == UV_UNKNOWN_HANDLE) {
    handle_01 = (uv_loop_t *)puVar15->data;
    uVar3 = *(uint *)((long)&handle_01->cloexec_lock + 0x34);
    if ((uVar3 & extraout_EDX) == 0) goto LAB_00165840;
    if ((~uVar3 & extraout_EDX) != 0) goto LAB_00165845;
    if ((extraout_EDX & 1) == 0) goto switchD_001653b5_caseD_4;
    iVar4 = rand();
    switch(iVar4 % 7) {
    case 0:
    case 1:
      uVar6 = (handle_01->cloexec_lock).__data.__wrphase_futex;
      puVar16 = (uv_loop_t *)(ulong)uVar6;
      sVar7 = recv(uVar6,connection_poll_cb::buffer,0x4a,0);
      uVar6 = (uint)sVar7;
      if (-1 < (int)uVar6) {
        if (uVar6 == 0) goto LAB_0016545a;
        plVar1 = (long *)((long)&handle_01->cloexec_lock + 0x10);
        *plVar1 = *plVar1 + (ulong)(uVar6 & 0x7fffffff);
        break;
      }
      goto LAB_00165854;
    case 2:
    case 3:
      uVar6 = (handle_01->cloexec_lock).__data.__wrphase_futex;
      puVar16 = (uv_loop_t *)(ulong)uVar6;
      uVar8 = recv(uVar6,connection_poll_cb::buffer_1,0x3a3,0);
      if (-1 < (int)uVar8) {
        if ((int)uVar8 != 0) {
          do {
            plVar1 = (long *)((long)&handle_01->cloexec_lock + 0x10);
            *plVar1 = *plVar1 + (uVar8 & 0xffffffff);
            uVar6 = (handle_01->cloexec_lock).__data.__wrphase_futex;
            puVar16 = (uv_loop_t *)(ulong)uVar6;
            uVar8 = recv(uVar6,connection_poll_cb::buffer_1,0x3a3,0);
          } while (0 < (int)uVar8);
          if ((int)uVar8 != 0) {
            piVar9 = __errno_location();
            if ((*piVar9 == 0xb) || (*piVar9 == 0x73)) break;
            connection_poll_cb_cold_4();
          }
        }
LAB_0016545a:
        *(undefined4 *)((long)&handle_01->cloexec_lock + 0x28) = 1;
        uVar3 = uVar3 & 0xfffffffe;
        break;
      }
      goto LAB_00165859;
    case 4:
      break;
    case 5:
      uVar3 = uVar3 & 0xfffffffe;
      puVar16 = (uv_loop_t *)&(handle_01->wq_mutex).__data.__list;
      puVar17 = puVar16;
      iVar4 = uv_is_active((uv_handle_t *)puVar16);
      if (iVar4 == 0) {
        *(undefined4 *)&handle_01->closing_handles = 1;
        uv_timer_start((uv_timer_t *)puVar16,delay_timer_cb,10,0);
      }
      else {
        *(byte *)&handle_01->closing_handles = *(byte *)&handle_01->closing_handles | 1;
        puVar16 = puVar17;
      }
      break;
    case 6:
      uv_poll_start((uv_poll_t *)handle_01,2,connection_poll_cb);
      puVar16 = handle_01;
      uv_poll_start((uv_poll_t *)handle_01,1,connection_poll_cb);
      *(undefined4 *)((long)&handle_01->cloexec_lock + 0x34) = 1;
      break;
    default:
      goto switchD_001653b5_default;
    }
switchD_001653b5_caseD_4:
    if ((extraout_EDX & 2) == 0) goto switchD_0016563c_caseD_4;
    if ((*(ulong *)((long)&handle_01->cloexec_lock + 0x18) < 0x10000) &&
       ((test_mode != '\x01' || (*(int *)((long)&handle_01->cloexec_lock + 0x20) == 0)))) {
      iVar4 = rand();
      switch(iVar4 % 7) {
      case 0:
      case 1:
        lVar2 = *(long *)((long)&handle_01->cloexec_lock + 0x18);
        if (lVar2 == 0x10000) goto LAB_00165863;
        uVar8 = 0x10000 - lVar2;
        sVar10 = 0x67;
        if (uVar8 < 0x67) {
          sVar10 = uVar8;
        }
        uVar6 = (handle_01->cloexec_lock).__data.__wrphase_futex;
        puVar16 = (uv_loop_t *)(ulong)uVar6;
        sVar7 = send(uVar6,connection_poll_cb::buffer_2,sVar10,0);
        uVar6 = (uint)sVar7;
        if ((int)uVar6 < 0) {
          piVar9 = __errno_location();
          if ((*piVar9 != 0xb) && (*piVar9 != 0x73)) {
            connection_poll_cb_cold_13();
            goto LAB_001657d7;
          }
LAB_001657ec:
          spurious_writable_wakeups = spurious_writable_wakeups + 1;
          break;
        }
        if (uVar6 != 0) {
          plVar1 = (long *)((long)&handle_01->cloexec_lock + 0x18);
          *plVar1 = *plVar1 + (ulong)(uVar6 & 0x7fffffff);
          valid_writable_wakeups = valid_writable_wakeups + 1;
          break;
        }
        goto LAB_0016586d;
      case 2:
      case 3:
        lVar2 = *(long *)((long)&handle_01->cloexec_lock + 0x18);
        if (lVar2 == 0x10000) goto LAB_00165868;
        sVar10 = 0x10000 - lVar2;
        if (0x4d1 < sVar10) {
          sVar10 = 0x4d2;
        }
        uVar6 = (handle_01->cloexec_lock).__data.__wrphase_futex;
        puVar16 = (uv_loop_t *)(ulong)uVar6;
        sVar7 = send(uVar6,connection_poll_cb::buffer_3,sVar10,0);
        uVar6 = (uint)sVar7;
        if (-1 < (int)uVar6) {
          if (uVar6 != 0) {
            valid_writable_wakeups = valid_writable_wakeups + 1;
            uVar8 = *(long *)((long)&handle_01->cloexec_lock + 0x18) + (ulong)(uVar6 & 0x7fffffff);
            *(ulong *)((long)&handle_01->cloexec_lock + 0x18) = uVar8;
            while (uVar8 < 0x10000) {
              sVar10 = 0x10000 - uVar8;
              if (uVar8 < 0xfb2f) {
                sVar10 = 0x4d2;
              }
              uVar6 = (handle_01->cloexec_lock).__data.__wrphase_futex;
              puVar16 = (uv_loop_t *)(ulong)uVar6;
              sVar7 = send(uVar6,connection_poll_cb::buffer_3,sVar10,0);
              if ((int)(uint)sVar7 < 1) {
                piVar9 = __errno_location();
                if ((*piVar9 != 0xb) && (*piVar9 != 0x73)) {
                  connection_poll_cb_cold_8();
                  goto LAB_0016583b;
                }
                break;
              }
              uVar8 = *(long *)((long)&handle_01->cloexec_lock + 0x18) +
                      (ulong)((uint)sVar7 & 0x7fffffff);
              *(ulong *)((long)&handle_01->cloexec_lock + 0x18) = uVar8;
            }
            break;
          }
          goto LAB_00165872;
        }
LAB_001657d7:
        piVar9 = __errno_location();
        if ((*piVar9 == 0xb) || (*piVar9 == 0x73)) goto LAB_001657ec;
        goto LAB_0016587c;
      case 4:
        break;
      case 5:
        uVar3 = uVar3 & 0xfffffffd;
        handle = &(handle_01->wq_mutex).__data.__list;
        iVar4 = uv_is_active((uv_handle_t *)handle);
        if (iVar4 == 0) {
          *(undefined4 *)&handle_01->closing_handles = 2;
          uv_timer_start((uv_timer_t *)handle,delay_timer_cb,100,0);
        }
        else {
          *(byte *)&handle_01->closing_handles = *(byte *)&handle_01->closing_handles | 2;
        }
        break;
      case 6:
        uv_poll_start((uv_poll_t *)handle_01,1,connection_poll_cb);
        uv_poll_start((uv_poll_t *)handle_01,2,connection_poll_cb);
        *(undefined4 *)((long)&handle_01->cloexec_lock + 0x34) = 2;
        break;
      default:
        goto switchD_0016563c_default;
      }
switchD_0016563c_caseD_4:
      if ((extraout_EDX & 4) != 0) {
        (handle_01->cloexec_lock).__data.__flags = 1;
        disconnects = disconnects + 1;
        uVar3 = uVar3 & 0xfffffffb;
      }
      if (((*(int *)((long)&handle_01->cloexec_lock + 0x28) == 0) ||
          (*(int *)((long)&handle_01->cloexec_lock + 0x2c) == 0)) ||
         ((handle_01->cloexec_lock).__data.__flags == 0)) {
        if (uVar3 != *(uint *)((long)&handle_01->cloexec_lock + 0x34)) {
          *(uint *)((long)&handle_01->cloexec_lock + 0x34) = uVar3;
          uv_poll_start((uv_poll_t *)puVar15,uVar3,connection_poll_cb);
        }
      }
      else {
        close_socket((handle_01->cloexec_lock).__data.__wrphase_futex);
        uv_close((uv_handle_t *)handle_01,connection_close_cb);
        uv_close((uv_handle_t *)&(handle_01->wq_mutex).__data.__list,connection_close_cb);
        *(undefined4 *)((long)&handle_01->cloexec_lock + 0x34) = 0;
      }
      iVar4 = *(int *)((long)&handle_01->cloexec_lock + 0x34);
      iVar5 = uv_is_active((uv_handle_t *)puVar15);
      if (iVar4 != 0) {
        if (iVar5 == 1) {
          return 1;
        }
        connection_poll_cb_cold_16();
        iVar5 = extraout_EAX_00;
      }
      if (iVar5 == 0) {
        return 0;
      }
      goto LAB_0016584a;
    }
    uVar6 = (handle_01->cloexec_lock).__data.__wrphase_futex;
    puVar16 = (uv_loop_t *)(ulong)uVar6;
    iVar4 = shutdown(uVar6,1);
    if (iVar4 == 0) {
      *(undefined4 *)((long)&handle_01->cloexec_lock + 0x2c) = 1;
      uVar3 = uVar3 & 0xfffffffd;
      goto switchD_0016563c_caseD_4;
    }
  }
  else {
LAB_0016583b:
    connection_poll_cb_cold_1();
    puVar15 = puVar16;
LAB_00165840:
    connection_poll_cb_cold_18();
LAB_00165845:
    connection_poll_cb_cold_2();
LAB_0016584a:
    connection_poll_cb_cold_17();
    puVar16 = puVar15;
  }
  connection_poll_cb_cold_7();
LAB_00165854:
  connection_poll_cb_cold_5();
LAB_00165859:
  connection_poll_cb_cold_3();
switchD_001653b5_default:
  connection_poll_cb_cold_6();
LAB_00165863:
  connection_poll_cb_cold_14();
LAB_00165868:
  connection_poll_cb_cold_11();
LAB_0016586d:
  connection_poll_cb_cold_12();
LAB_00165872:
  connection_poll_cb_cold_9();
switchD_0016563c_default:
  connection_poll_cb_cold_15();
LAB_0016587c:
  connection_poll_cb_cold_10();
  iVar4 = close((int)puVar16);
  if ((iVar4 == 0) || (piVar9 = __errno_location(), *piVar9 == 0x68)) {
    return extraout_EAX_01;
  }
  close_socket_cold_1();
  puVar15 = (uv_loop_t *)puVar16->data;
  iVar4 = uv_is_active((uv_handle_t *)puVar16);
  if (iVar4 == 0) {
    if (*(uint *)&puVar15->closing_handles == 0) goto LAB_001658e3;
    uVar3 = *(uint *)&puVar15->closing_handles | *(uint *)((long)&puVar15->cloexec_lock + 0x34);
    *(uint *)((long)&puVar15->cloexec_lock + 0x34) = uVar3;
    *(undefined4 *)&puVar15->closing_handles = 0;
    iVar4 = uv_poll_start((uv_poll_t *)puVar15,uVar3,connection_poll_cb);
    if (iVar4 == 0) {
      return 0;
    }
  }
  else {
    delay_timer_cb_cold_1();
LAB_001658e3:
    puVar15 = puVar16;
    delay_timer_cb_cold_3();
  }
  delay_timer_cb_cold_2();
  puVar14 = (undefined8 *)puVar15->data;
  piVar9 = (int *)((long)puVar14 + 0x154);
  *piVar9 = *piVar9 + -1;
  if (*piVar9 != 0) {
    return extraout_EAX_02;
  }
  if ((test_mode == '\x01') && (*(int *)(puVar14 + 0x2a) == 0)) {
    if (puVar14[0x28] != 0) {
      connection_close_cb_cold_2();
LAB_0016595f:
      connection_close_cb_cold_1();
      goto LAB_00165964;
    }
  }
  else if (puVar14[0x28] != 0x10000) goto LAB_0016595f;
  if ((test_mode != '\0') && (*(int *)(puVar14 + 0x2a) != 0)) {
    if (puVar14[0x29] == 0) goto LAB_00165944;
    connection_close_cb_cold_3();
  }
  if (puVar14[0x29] != 0x10000) {
LAB_00165964:
    connection_close_cb_cold_4();
    free((void *)*puVar14);
    return extraout_EAX_04;
  }
LAB_00165944:
  closed_connections = closed_connections + 1;
  free(puVar14);
  return extraout_EAX_03;
}

Assistant:

static uv_os_sock_t create_bound_socket (struct sockaddr_in bind_addr) {
  uv_os_sock_t sock;
  int r;

  sock = socket(AF_INET, SOCK_STREAM, IPPROTO_IP);
#ifdef _WIN32
  ASSERT(sock != INVALID_SOCKET);
#else
  ASSERT(sock >= 0);
#endif

#ifndef _WIN32
  {
    /* Allow reuse of the port. */
    int yes = 1;
    r = setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof yes);
    ASSERT(r == 0);
  }
#endif

  r = bind(sock, (const struct sockaddr*) &bind_addr, sizeof bind_addr);
  ASSERT(r == 0);

  return sock;
}